

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O3

bool __thiscall
crnlib::crn_comp::compress_pass(crn_comp *this,crn_comp_params *params,float *pEffective_bitrate)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  uint *puVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  float fVar10;
  
  clear(this);
  if (pEffective_bitrate != (float *)0x0) {
    *pEffective_bitrate = 0.0;
  }
  this->m_pParams = params;
  this->m_has_etc_color_blocks = (ulong)(params->m_format + ~cCRNFmtDXT5A) < 5;
  this->m_has_subblocks =
       params->m_format == cCRNFmtETC2A || (params->m_format & ~cCRNFmtDXT3) == cCRNFmtETC1;
  uVar1 = params->m_width;
  uVar8 = params->m_height;
  uVar2 = uVar8;
  if (uVar1 >= uVar8 && uVar1 != uVar8) {
    uVar2 = uVar1;
  }
  if (uVar1 < uVar8) {
    uVar8 = uVar1;
  }
  bVar3 = false;
  if ((uVar8 != 0) && (bVar3 = false, uVar2 < 0x1001)) {
    iVar4 = task_pool::init(&this->m_task_pool,(EVP_PKEY_CTX *)(ulong)params->m_num_helper_threads);
    if ((char)iVar4 == '\0') {
      bVar3 = false;
    }
    else {
      bVar3 = compress_internal(this);
      task_pool::deinit(&this->m_task_pool);
      if (bVar3 && pEffective_bitrate != (float *)0x0) {
        uVar5 = (ulong)this->m_pParams->m_faces;
        if (uVar5 == 0) {
          fVar10 = 0.0;
        }
        else {
          uVar1 = this->m_pParams->m_levels;
          puVar6 = &this->m_images[0][0].m_height;
          uVar7 = 0;
          uVar8 = 0;
          do {
            if (uVar1 != 0) {
              lVar9 = 0;
              do {
                uVar8 = uVar8 + *(int *)((long)puVar6 + lVar9) * *(int *)((long)puVar6 + lVar9 + -4)
                ;
                lVar9 = lVar9 + 0x30;
              } while ((ulong)uVar1 * 0x30 != lVar9);
            }
            uVar7 = uVar7 + 1;
            puVar6 = puVar6 + 0xc0;
          } while (uVar7 != uVar5);
          fVar10 = (float)uVar8;
        }
        *pEffective_bitrate = ((float)(this->m_comp_data).m_size * 8.0) / fVar10;
        bVar3 = true;
      }
    }
  }
  return bVar3;
}

Assistant:

bool crn_comp::compress_pass(const crn_comp_params& params, float* pEffective_bitrate) {
  clear();

  if (pEffective_bitrate)
    *pEffective_bitrate = 0.0f;

  m_pParams = &params;
  m_has_etc_color_blocks = params.m_format == cCRNFmtETC1 || params.m_format == cCRNFmtETC2 || params.m_format == cCRNFmtETC2A || params.m_format == cCRNFmtETC1S || params.m_format == cCRNFmtETC2AS;
  m_has_subblocks = params.m_format == cCRNFmtETC1 || params.m_format == cCRNFmtETC2 || params.m_format == cCRNFmtETC2A;

  if ((math::minimum(m_pParams->m_width, m_pParams->m_height) < 1) || (math::maximum(m_pParams->m_width, m_pParams->m_height) > cCRNMaxLevelResolution))
    return false;

  if (!m_task_pool.init(params.m_num_helper_threads))
    return false;

  bool status = compress_internal();

  m_task_pool.deinit();

  if ((status) && (pEffective_bitrate)) {
    uint total_pixels = 0;

    for (uint f = 0; f < m_pParams->m_faces; f++)
      for (uint l = 0; l < m_pParams->m_levels; l++)
        total_pixels += m_images[f][l].get_total_pixels();

    *pEffective_bitrate = (m_comp_data.size() * 8.0f) / total_pixels;
  }

  return status;
}